

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_extract.cpp
# Opt level: O1

void duckdb::ListExtractFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  LogicalTypeId LVar2;
  VectorType VVar3;
  VectorType VVar4;
  __uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_> _Var5;
  unsigned_long *puVar6;
  anon_union_16_2_67f50693_for_value *paVar7;
  data_ptr_t pdVar8;
  undefined8 uVar9;
  sel_t *psVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar11;
  iterator iVar12;
  SelectionVector *pSVar13;
  reference vector;
  reference vector_00;
  Vector *pVVar14;
  idx_t iVar15;
  idx_t iVar16;
  TemplatedValidityData<unsigned_long> *pTVar17;
  NotImplementedException *this_00;
  idx_t iVar18;
  ulong uVar19;
  unsigned_long uVar20;
  unsigned_long *invalid_offset;
  idx_t *piVar21;
  long lVar22;
  ulong uVar23;
  int64_t in_R9;
  idx_t idx_in_entry;
  ulong uVar24;
  ulong uVar25;
  data_ptr_t pdVar26;
  data_ptr_t pdVar27;
  ulong uVar28;
  data_ptr_t pdVar29;
  unsigned_long uVar30;
  anon_struct_16_3_d7536bce_for_pointer aVar31;
  string_t sVar32;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  string_t input_07;
  string_t input_08;
  string_t input_09;
  vector<unsigned_long,_true> invalid_offsets;
  optional_idx first_valid_child_idx;
  SelectionVector sel;
  UnifiedVectorFormat list_data;
  optional_idx child_offset;
  UnifiedVectorFormat offsets_data;
  UnifiedVectorFormat child_data;
  idx_t local_180;
  unsigned_long local_158;
  optional_idx local_150;
  idx_t *local_148;
  iterator iStack_140;
  unsigned_long *local_138;
  optional_idx local_130;
  SelectionVector local_128;
  undefined1 local_110 [16];
  SelectionVector local_100 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d0;
  optional_idx local_c8;
  UnifiedVectorFormat local_c0;
  UnifiedVectorFormat local_78;
  
  local_180 = args->count;
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  vector_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  LVar2 = (vector->type).id_;
  if (LVar2 != SQLNULL) {
    if (LVar2 != VARCHAR) {
      if (LVar2 != LIST) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_110._0_8_ = local_100;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_110,"Specifier type not implemented","");
        NotImplementedException::NotImplementedException(this_00,(string *)local_110);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_110);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
      Vector::ToUnifiedFormat(vector,local_180,(UnifiedVectorFormat *)local_110);
      Vector::ToUnifiedFormat(vector_00,local_180,&local_c0);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
      pVVar14 = ListVector::GetEntry(vector);
      iVar15 = ListVector::GetListSize(vector);
      Vector::ToUnifiedFormat(pVVar14,iVar15,&local_78);
      SelectionVector::SelectionVector(&local_128,local_180);
      local_148 = (idx_t *)0x0;
      iStack_140._M_current = (idx_t *)0x0;
      local_138 = (unsigned_long *)0x0;
      local_130.index = 0xffffffffffffffff;
      local_158 = 0;
      if (local_180 != 0) {
        do {
          uVar30 = local_158;
          if (*(long *)local_110._0_8_ != 0) {
            uVar30 = (unsigned_long)*(uint *)(*(long *)local_110._0_8_ + local_158 * 4);
          }
          uVar20 = local_158;
          if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
            uVar20 = (unsigned_long)(local_c0.sel)->sel_vector[local_158];
          }
          if ((((unsigned_long *)local_100[0].sel_vector == (unsigned_long *)0x0) ||
              ((*(ulong *)((long)local_100[0].sel_vector + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1
               ) != 0)) &&
             ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0 ||
              ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                [uVar20 >> 6] >> (uVar20 & 0x3f) & 1) != 0)))) {
            lVar22 = *(long *)(local_c0.data + uVar20 * 8);
            if (lVar22 == 0) {
LAB_00924240:
              local_150.index = 0xffffffffffffffff;
            }
            else {
              uVar23 = lVar22 - (ulong)(0 < lVar22);
              uVar28 = ((long *)(local_110._8_8_ + uVar30 * 0x10))[1];
              if ((long)uVar23 < 0) {
                uVar23 = uVar23 + uVar28;
                if ((long)uVar23 < 0) goto LAB_00924240;
              }
              else if (uVar28 <= uVar23) goto LAB_00924240;
              optional_idx::optional_idx
                        (&local_150,uVar23 + *(long *)(local_110._8_8_ + uVar30 * 0x10));
            }
            pSVar13 = local_78.sel;
            local_c8.index = local_150.index;
            if (local_150.index == 0xffffffffffffffff) {
              if (iStack_140._M_current != local_138) {
                *iStack_140._M_current = local_158;
                goto LAB_009242f5;
              }
              ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,
                         iStack_140,&local_158);
            }
            else {
              iVar15 = optional_idx::GetIndex(&local_c8);
              _Var5._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (((unsafe_unique_array<unsigned_long> *)&pSVar13->sel_vector)->
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>)._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t;
              if ((_Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
                  _Var5._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0
                 ) {
                iVar15 = (idx_t)*(uint *)((long)_Var5._M_t.
                                                super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                                                .super__Head_base<0UL,_unsigned_long_*,_false>.
                                                _M_head_impl + iVar15 * 4);
              }
              local_128.sel_vector[local_158] = (sel_t)iVar15;
              if (local_130.index == 0xffffffffffffffff) {
                optional_idx::optional_idx(&local_150,iVar15);
                local_130.index = local_150.index;
              }
            }
          }
          else if (iStack_140._M_current == local_138) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_148,iStack_140,
                       &local_158);
          }
          else {
            *iStack_140._M_current = local_158;
LAB_009242f5:
            iStack_140._M_current = iStack_140._M_current + 1;
          }
          local_158 = local_158 + 1;
        } while (local_158 < local_180);
      }
      iVar12._M_current = iStack_140._M_current;
      piVar21 = local_148;
      if (local_130.index != 0xffffffffffffffff) {
        if (local_148 != iStack_140._M_current) {
          do {
            iVar15 = *piVar21;
            iVar16 = optional_idx::GetIndex(&local_130);
            local_128.sel_vector[iVar15] = (sel_t)iVar16;
            piVar21 = piVar21 + 1;
          } while (piVar21 != iVar12._M_current);
        }
        VectorOperations::Copy(pVVar14,result,&local_128,local_180,0,0);
        piVar21 = local_148;
        iVar12._M_current = iStack_140._M_current;
      }
      for (; piVar21 != iVar12._M_current; piVar21 = piVar21 + 1) {
        FlatVector::SetNull(result,*piVar21,true);
      }
      if ((local_180 == 1) ||
         ((vector->vector_type == CONSTANT_VECTOR && (vector_00->vector_type == CONSTANT_VECTOR))))
      {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
      Vector::Verify(result,local_180);
      if (local_148 != (idx_t *)0x0) {
        operator_delete(local_148);
      }
      if (local_128.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
LAB_0092449f:
      if (local_c0.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0._M_pi);
      }
      if (local_100[0].selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_100[0].selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      return;
    }
    VVar3 = vector->vector_type;
    VVar4 = vector_00->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      paVar7 = (anon_union_16_2_67f50693_for_value *)result->data;
      if (((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) &&
         ((puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
          puVar6 == (unsigned_long *)0x0 || ((*puVar6 & 1) != 0)))) {
        sVar32.value.pointer.ptr = (char *)*(undefined8 *)vector_00->data;
        sVar32.value._0_8_ = *(undefined8 *)(vector->data + 8);
        aVar31 = (anon_struct_16_3_d7536bce_for_pointer)
                 SubstringUnicode((duckdb *)result,*(Vector **)vector->data,sVar32,1,in_R9);
        paVar7->pointer = aVar31;
        return;
      }
      goto LAB_009246e2;
    }
    if ((VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
      pdVar26 = vector->data;
      pdVar8 = vector_00->data;
      puVar6 = (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar27 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_180 == 0) {
            return;
          }
          uVar9 = *(undefined8 *)pdVar8;
          lVar22 = 8;
          do {
            input_04.value.pointer.ptr = (char *)uVar9;
            input_04.value._0_8_ = *(undefined8 *)(pdVar26 + lVar22);
            sVar32 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar26 + lVar22 + -8),input_04,
                                      1,in_R9);
            *(long *)(pdVar27 + lVar22 + -8) = sVar32.value._0_8_;
            *(long *)(pdVar27 + lVar22) = sVar32.value._8_8_;
            lVar22 = lVar22 + 0x10;
            local_180 = local_180 - 1;
          } while (local_180 != 0);
          return;
        }
        if (local_180 + 0x3f < 0x40) {
          return;
        }
        uVar23 = 0;
        uVar28 = 0;
        do {
          puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar6 == (unsigned_long *)0x0) {
            uVar30 = 0xffffffffffffffff;
          }
          else {
            uVar30 = puVar6[uVar23];
          }
          uVar19 = uVar28 + 0x40;
          if (local_180 <= uVar28 + 0x40) {
            uVar19 = local_180;
          }
          uVar24 = uVar19;
          if (uVar30 != 0) {
            uVar24 = uVar28;
            if (uVar30 == 0xffffffffffffffff) {
              if (uVar28 < uVar19) {
                uVar9 = *(undefined8 *)pdVar8;
                uVar28 = uVar28 << 4 | 8;
                do {
                  input.value.pointer.ptr = (char *)uVar9;
                  input.value._0_8_ = *(undefined8 *)(pdVar26 + uVar28);
                  sVar32 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar26 + (uVar28 - 8)),
                                            input,1,in_R9);
                  *(long *)(pdVar27 + (uVar28 - 8)) = sVar32.value._0_8_;
                  *(long *)(pdVar27 + uVar28) = sVar32.value._8_8_;
                  uVar24 = uVar24 + 1;
                  uVar28 = uVar28 + 0x10;
                } while (uVar19 != uVar24);
              }
            }
            else if (uVar28 < uVar19) {
              uVar24 = uVar28 << 4 | 8;
              uVar25 = 0;
              do {
                if ((uVar30 >> (uVar25 & 0x3f) & 1) != 0) {
                  input_00.value.pointer.ptr = (char *)*(undefined8 *)pdVar8;
                  input_00.value._0_8_ = *(undefined8 *)(pdVar26 + uVar24);
                  sVar32 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar26 + (uVar24 - 8)),
                                            input_00,1,in_R9);
                  *(long *)(pdVar27 + (uVar24 - 8)) = sVar32.value._0_8_;
                  *(long *)(pdVar27 + uVar24) = sVar32.value._8_8_;
                }
                uVar25 = uVar25 + 1;
                uVar24 = uVar24 + 0x10;
              } while ((uVar28 - uVar19) + uVar25 != 0);
              uVar24 = uVar28 + uVar25;
            }
          }
          uVar23 = uVar23 + 1;
          uVar28 = uVar24;
        } while (uVar23 != local_180 + 0x3f >> 6);
        return;
      }
    }
    else {
      if ((VVar3 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar4 != FLAT_VECTOR) {
        if (VVar4 == FLAT_VECTOR && VVar3 == FLAT_VECTOR) {
          pdVar26 = vector->data;
          pdVar8 = vector_00->data;
          Vector::SetVectorType(result,FLAT_VECTOR);
          pdVar27 = result->data;
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::VerifyFlatVector(result);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                     &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
               (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          FlatVector::VerifyFlatVector(vector_00);
          ValidityMask::Combine(&result->validity,&vector_00->validity,local_180);
          if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            if (local_180 == 0) {
              return;
            }
            lVar22 = 0;
            do {
              input_09.value.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + lVar22);
              input_09.value._0_8_ = *(undefined8 *)(pdVar26 + lVar22 * 2 + 8);
              sVar32 = SubstringUnicode((duckdb *)result,*(Vector **)(pdVar26 + lVar22 * 2),input_09
                                        ,1,in_R9);
              *(long *)(pdVar27 + lVar22 * 2) = sVar32.value._0_8_;
              *(long *)(pdVar27 + lVar22 * 2 + 8) = sVar32.value._8_8_;
              lVar22 = lVar22 + 8;
              local_180 = local_180 - 1;
            } while (local_180 != 0);
            return;
          }
          if (local_180 + 0x3f < 0x40) {
            return;
          }
          uVar23 = 0;
          uVar28 = 0;
          do {
            puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar6 == (unsigned_long *)0x0) {
              uVar30 = 0xffffffffffffffff;
            }
            else {
              uVar30 = puVar6[uVar23];
            }
            uVar19 = uVar28 + 0x40;
            if (local_180 <= uVar28 + 0x40) {
              uVar19 = local_180;
            }
            uVar24 = uVar19;
            if (uVar30 != 0) {
              uVar24 = uVar28;
              if (uVar30 == 0xffffffffffffffff) {
                if (uVar28 < uVar19) {
                  lVar22 = uVar28 * 2 + 1;
                  do {
                    input_05.value.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + uVar28 * 8);
                    input_05.value._0_8_ = *(undefined8 *)(pdVar26 + lVar22 * 8);
                    sVar32 = SubstringUnicode((duckdb *)result,
                                              *(Vector **)(pdVar26 + lVar22 * 8 + -8),input_05,1,
                                              in_R9);
                    *(long *)(pdVar27 + lVar22 * 8 + -8) = sVar32.value._0_8_;
                    *(long *)(pdVar27 + lVar22 * 8) = sVar32.value._8_8_;
                    uVar28 = uVar28 + 1;
                    lVar22 = lVar22 + 2;
                    uVar24 = uVar28;
                  } while (uVar19 != uVar28);
                }
              }
              else if (uVar28 < uVar19) {
                lVar22 = uVar28 * 2 + 1;
                uVar24 = 0;
                do {
                  if ((uVar30 >> (uVar24 & 0x3f) & 1) != 0) {
                    input_06.value.pointer.ptr =
                         (char *)*(undefined8 *)(pdVar8 + uVar24 * 8 + uVar28 * 8);
                    input_06.value._0_8_ = *(undefined8 *)(pdVar26 + lVar22 * 8);
                    sVar32 = SubstringUnicode((duckdb *)result,
                                              *(Vector **)(pdVar26 + lVar22 * 8 + -8),input_06,1,
                                              in_R9);
                    *(long *)(pdVar27 + lVar22 * 8 + -8) = sVar32.value._0_8_;
                    *(long *)(pdVar27 + lVar22 * 8) = sVar32.value._8_8_;
                  }
                  uVar24 = uVar24 + 1;
                  lVar22 = lVar22 + 2;
                } while ((uVar28 - uVar19) + uVar24 != 0);
                uVar24 = uVar28 + uVar24;
              }
            }
            uVar23 = uVar23 + 1;
            uVar28 = uVar24;
          } while (uVar23 != local_180 + 0x3f >> 6);
          return;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_110);
        UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
        Vector::ToUnifiedFormat(vector,local_180,(UnifiedVectorFormat *)local_110);
        Vector::ToUnifiedFormat(vector_00,local_180,&local_c0);
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar26 = result->data;
        FlatVector::VerifyFlatVector(result);
        if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0 && (unsigned_long *)local_100[0].sel_vector == (unsigned_long *)0x0
           ) {
          if (local_180 != 0) {
            lVar22 = *(long *)local_110._0_8_;
            psVar10 = (local_c0.sel)->sel_vector;
            pdVar26 = pdVar26 + 8;
            iVar15 = 0;
            do {
              iVar16 = iVar15;
              if (lVar22 != 0) {
                iVar16 = (idx_t)*(uint *)(lVar22 + iVar15 * 4);
              }
              iVar18 = iVar15;
              if (psVar10 != (sel_t *)0x0) {
                iVar18 = (idx_t)psVar10[iVar15];
              }
              input_01.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + iVar18 * 8);
              input_01.value._0_8_ = *(undefined8 *)(local_110._8_8_ + iVar16 * 0x10 + 8);
              sVar32 = SubstringUnicode((duckdb *)result,
                                        *(Vector **)(local_110._8_8_ + iVar16 * 0x10),input_01,1,
                                        in_R9);
              *(long *)(pdVar26 + -8) = sVar32.value._0_8_;
              *(long *)pdVar26 = sVar32.value._8_8_;
              iVar15 = iVar15 + 1;
              pdVar26 = pdVar26 + 0x10;
            } while (local_180 != iVar15);
          }
        }
        else if (local_180 != 0) {
          lVar22 = *(long *)local_110._0_8_;
          psVar10 = (local_c0.sel)->sel_vector;
          pdVar26 = pdVar26 + 8;
          uVar28 = 0;
          do {
            uVar23 = uVar28;
            if (lVar22 != 0) {
              uVar23 = (ulong)*(uint *)(lVar22 + uVar28 * 4);
            }
            uVar19 = uVar28;
            if (psVar10 != (sel_t *)0x0) {
              uVar19 = (ulong)psVar10[uVar28];
            }
            if ((((unsigned_long *)local_100[0].sel_vector == (unsigned_long *)0x0) ||
                ((*(ulong *)((long)local_100[0].sel_vector + (uVar23 >> 6) * 8) >> (uVar23 & 0x3f) &
                 1) != 0)) &&
               ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                 (unsigned_long *)0x0 ||
                ((local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                  [uVar19 >> 6] >> (uVar19 & 0x3f) & 1) != 0)))) {
              input_07.value.pointer.ptr = (char *)*(undefined8 *)(local_c0.data + uVar19 * 8);
              input_07.value._0_8_ = *(undefined8 *)(local_110._8_8_ + uVar23 * 0x10 + 8);
              sVar32 = SubstringUnicode((duckdb *)result,
                                        *(Vector **)(local_110._8_8_ + uVar23 * 0x10),input_07,1,
                                        in_R9);
              *(long *)(pdVar26 + -8) = sVar32.value._0_8_;
              *(long *)pdVar26 = sVar32.value._8_8_;
            }
            else {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_128.sel_vector =
                     (sel_t *)(result->validity).super_TemplatedValidityMask<unsigned_long>.capacity
                ;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&local_78,(unsigned_long *)&local_128);
                pdVar8 = local_78.data;
                pSVar13 = local_78.sel;
                local_78.sel = (SelectionVector *)0x0;
                local_78.data = (data_ptr_t)0x0;
                this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)pSVar13;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdVar8;
                if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.data);
                }
                pTVar17 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                      validity_data);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar17->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar11 = (byte)uVar28 & 0x3f;
              puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar28 >> 6);
              *puVar1 = *puVar1 & (-2L << bVar11 | 0xfffffffffffffffeU >> 0x40 - bVar11);
            }
            uVar28 = uVar28 + 1;
            pdVar26 = pdVar26 + 0x10;
          } while (local_180 != uVar28);
        }
        goto LAB_0092449f;
      }
      pdVar26 = vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      pdVar8 = vector_00->data;
      if ((puVar6 == (unsigned_long *)0x0) || ((*puVar6 & 1) != 0)) {
        Vector::SetVectorType(result,FLAT_VECTOR);
        pdVar27 = result->data;
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::VerifyFlatVector(result);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                   &(vector_00->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
        (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
             (vector_00->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          if (local_180 == 0) {
            return;
          }
          pVVar14 = *(Vector **)pdVar26;
          uVar9 = *(undefined8 *)(pdVar26 + 8);
          pdVar27 = pdVar27 + 8;
          iVar15 = 0;
          do {
            input_08.value.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + iVar15 * 8);
            input_08.value._0_8_ = uVar9;
            sVar32 = SubstringUnicode((duckdb *)result,pVVar14,input_08,1,in_R9);
            *(long *)(pdVar27 + -8) = sVar32.value._0_8_;
            *(long *)pdVar27 = sVar32.value._8_8_;
            iVar15 = iVar15 + 1;
            pdVar27 = pdVar27 + 0x10;
          } while (local_180 != iVar15);
          return;
        }
        if (local_180 + 0x3f < 0x40) {
          return;
        }
        uVar23 = 0;
        uVar28 = 0;
        do {
          puVar6 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar6 == (unsigned_long *)0x0) {
            uVar30 = 0xffffffffffffffff;
          }
          else {
            uVar30 = puVar6[uVar23];
          }
          uVar19 = uVar28 + 0x40;
          if (local_180 <= uVar28 + 0x40) {
            uVar19 = local_180;
          }
          uVar24 = uVar19;
          if (uVar30 != 0) {
            uVar24 = uVar28;
            if (uVar30 == 0xffffffffffffffff) {
              if (uVar28 < uVar19) {
                pVVar14 = *(Vector **)pdVar26;
                uVar9 = *(undefined8 *)(pdVar26 + 8);
                pdVar29 = pdVar27 + uVar28 * 0x10 + 8;
                do {
                  input_02.value.pointer.ptr = (char *)*(undefined8 *)(pdVar8 + uVar24 * 8);
                  input_02.value._0_8_ = uVar9;
                  sVar32 = SubstringUnicode((duckdb *)result,pVVar14,input_02,1,in_R9);
                  *(long *)(pdVar29 + -8) = sVar32.value._0_8_;
                  *(long *)pdVar29 = sVar32.value._8_8_;
                  uVar24 = uVar24 + 1;
                  pdVar29 = pdVar29 + 0x10;
                } while (uVar19 != uVar24);
              }
            }
            else if (uVar28 < uVar19) {
              pdVar29 = pdVar27 + uVar28 * 0x10 + 8;
              uVar24 = 0;
              do {
                if ((uVar30 >> (uVar24 & 0x3f) & 1) != 0) {
                  input_03.value.pointer.ptr =
                       (char *)*(undefined8 *)(pdVar8 + uVar24 * 8 + uVar28 * 8);
                  input_03.value._0_8_ = *(undefined8 *)(pdVar26 + 8);
                  sVar32 = SubstringUnicode((duckdb *)result,*(Vector **)pdVar26,input_03,1,in_R9);
                  *(long *)(pdVar29 + -8) = sVar32.value._0_8_;
                  *(long *)pdVar29 = sVar32.value._8_8_;
                }
                uVar24 = uVar24 + 1;
                pdVar29 = pdVar29 + 0x10;
              } while ((uVar28 - uVar19) + uVar24 != 0);
              uVar24 = uVar28 + uVar24;
            }
          }
          uVar23 = uVar23 + 1;
          uVar28 = uVar24;
        } while (uVar23 != local_180 + 0x3f >> 6);
        return;
      }
    }
  }
  Vector::SetVectorType(result,CONSTANT_VECTOR);
LAB_009246e2:
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ListExtractFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	auto count = args.size();

	Vector &base = args.data[0];
	Vector &subscript = args.data[1];

	switch (base.GetType().id()) {
	case LogicalTypeId::LIST:
		ExecuteListExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteStringExtract(result, base, subscript, count);
		break;
	case LogicalTypeId::SQLNULL:
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}